

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **args)

{
  Box<objectbox::tsdemo::SensorValues> box;
  char cVar1;
  ostream *poVar2;
  char *pcVar3;
  OBX_model *model;
  int64_t now;
  Options options;
  vector<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_> values;
  StopWatch stopWatch;
  Box<objectbox::tsdemo::SensorValues> boxSV;
  string local_b8;
  Box<objectbox::tsdemo::NamedTimeRange> boxNTR;
  Store store;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"ObjectBox TS demo using ObjectBox library ");
  pcVar3 = (char *)obx_version_string();
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2," (core: ");
  pcVar3 = (char *)obx_version_core_string();
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2,")");
  std::endl<char,std::char_traits<char>>(poVar2);
  cVar1 = obx_has_feature(2);
  if (cVar1 != '\0') {
    model = (OBX_model *)obx_model();
    if (model != (OBX_model *)0x0) {
      obx_model_entity(model,"NamedTimeRange",1,0x3441081f55e8228d);
      obx_model_property(model,"id",6,1,0x495d3217fb1fed14);
      obx_model_property_flags(model,1);
      obx_model_property(model,"begin",10,2,0x5b821015ee281fa9);
      obx_model_property(model,"end",10,3,0x1ee66d6a77dbc649);
      obx_model_property(model,"name",9,4,0x7250114c30cbdb95);
      obx_model_entity_last_property_id(model,4,0x7250114c30cbdb95);
      obx_model_entity(model,"SensorValues",2,0x5b444a135bb7137f);
      obx_model_property(model,"id",6,1,0x66911fc3e14f56ee);
      obx_model_property_flags(model,1);
      obx_model_property(model,"time",10,2,0x3822dd8e3248ec74);
      obx_model_property_flags(model,0x4000);
      obx_model_property(model,"temperatureOutside",8,3,0x105a5228614e1155);
      obx_model_property(model,"temperatureInside",8,4,0xb2651d7c696391b);
      obx_model_property(model,"temperatureCpu",8,5,0x3e2cfc77907880e2);
      obx_model_property(model,"loadCpu1",8,6,0x4e086058010bfe5f);
      obx_model_property(model,"loadCpu2",8,7,0x7440ca653dc6fed2);
      obx_model_property(model,"loadCpu3",8,8,0x1b5e2b57008f5a6e);
      obx_model_property(model,"loadCpu4",8,9,0x60849bc50f7a4b0d);
      obx_model_entity_last_property_id(model,9,0x60849bc50f7a4b0d);
      obx_model_last_entity_id(model,2,0x5b444a135bb7137f);
    }
    obx::Options::Options(&options,model);
    obx_opt_max_db_size_in_kb(options.opt,0xa00000);
    obx::Store::Store(&store,&options);
    obx::Box<objectbox::tsdemo::NamedTimeRange>::Box(&boxNTR,&store);
    obx::Box<objectbox::tsdemo::SensorValues>::Box(&boxSV,&store);
    poVar2 = std::operator<<((ostream *)&std::cout,"ObjectBox store opened");
    std::endl<char,std::char_traits<char>>(poVar2);
    now = millisSinceEpoch();
    obx::BoxTypeless::removeAll(&boxNTR.super_BoxTypeless);
    box.super_BoxTypeless.cBox_ = boxSV.super_BoxTypeless.cBox_;
    box.super_BoxTypeless.store_ = boxSV.super_BoxTypeless.store_;
    box.super_BoxTypeless.entityTypeId_ = boxSV.super_BoxTypeless.entityTypeId_;
    box.super_BoxTypeless._20_4_ = boxSV.super_BoxTypeless._20_4_;
    removeDataBefore(box,now + -5000);
    createSensorValueData(&values,now,1000000);
    stopWatch.start_.__d.__r = (time_point)std::chrono::_V2::steady_clock::now();
    obx::Box<objectbox::tsdemo::SensorValues>::
    putMany<std::vector<objectbox::tsdemo::SensorValues,std::allocator<objectbox::tsdemo::SensorValues>>>
              (&boxSV,&values,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0,
               OBXPutMode_PUT);
    poVar2 = std::operator<<((ostream *)&std::cout,"Put ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,1000000);
    poVar2 = std::operator<<(poVar2," objects in ");
    objectbox::StopWatch::durationForLog_abi_cxx11_(&local_b8,&stopWatch);
    poVar2 = std::operator<<(poVar2,(string *)&local_b8);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_b8);
    if (values.
        super__Vector_base<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        values.
        super__Vector_base<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      values.
      super__Vector_base<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           values.
           super__Vector_base<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>
           ._M_impl.super__Vector_impl_data._M_start;
    }
    putAndPrintNamedTimeRanges(&boxNTR,now);
    printMinMaxTime(&boxSV,now);
    buildAndRunQueries(&boxSV,now);
    std::
    _Vector_base<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>
    ::~_Vector_base(&values.
                     super__Vector_base<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>
                   );
    obx::Store::~Store(&store);
    obx::Options::~Options(&options);
    return 0;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "This time series demo requires ObjectBox TS, a special time series edition."
                          );
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "To get ObjectBox TS, please visit https://objectbox.io/time-series-database/."
                          );
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(1);
}

Assistant:

int main(int argc, char* args[]) {
    std::cout << "ObjectBox TS demo using ObjectBox library " << obx_version_string()
              << " (core: " << obx_version_core_string() << ")" << std::endl;

    if (!obx_has_feature(OBXFeature_TimeSeries)) {
        std::cout << "This time series demo requires ObjectBox TS, a special time series edition." << std::endl;
        std::cout << "To get ObjectBox TS, please visit https://objectbox.io/time-series-database/." << std::endl;
        exit(1);
    }

    // Init ObjectBox store and boxes
    obx::Options options(create_obx_model());
    options.maxDbSizeInKb(10 * 1024 * 1024);  // 10 GB to allow data from several runs
    obx::Store store(options);
    obx::Box<NamedTimeRange> boxNTR(store);
    obx::Box<SensorValues> boxSV(store);
    std::cout << "ObjectBox store opened" << std::endl;

    int64_t start = millisSinceEpoch();
    boxNTR.removeAll();
    removeDataBefore(boxSV, start - 5000);  // Older than 5s
    // boxSV.removeAll();  // Or remove all if you prefer consistent data each run

    // Create some SensorValues dummy data and put it in the database (while measuring the time for put)
    int dataCount = 1000000;
    std::vector<SensorValues> values = createSensorValueData(start, dataCount);
    StopWatch stopWatch;
    boxSV.put(values);
    std::cout << "Put " << dataCount << " objects in " << stopWatch.durationForLog() << std::endl;
    values.clear();  // Free memory for putted objects (optional)

    putAndPrintNamedTimeRanges(boxNTR, start);

    printMinMaxTime(boxSV, start);

    buildAndRunQueries(boxSV, start);

    return 0;
}